

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UnspecifiedAttachmentSizeCase::test
          (UnspecifiedAttachmentSizeCase *this)

{
  CallLogWrapper *this_00;
  GLuint framebufferID;
  GLuint local_1c;
  
  local_1c = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&local_1c);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7])(this);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// check color target
		testColorAttachment();

		// check depth target
		testDepthAttachment();

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}